

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::CachingPhysicalOperator::Execute
          (CachingPhysicalOperator *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk
          ,GlobalOperatorState *gstate,OperatorState *state_p)

{
  __uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *this_00;
  byte bVar1;
  int iVar2;
  DataChunk *this_01;
  pointer pDVar3;
  Allocator *pAVar4;
  type chunk_00;
  vector<duckdb::LogicalType,_true> vStack_48;
  
  iVar2 = (*(this->super_PhysicalOperator)._vptr_PhysicalOperator[0x27])();
  if (*(char *)&state_p[2]._vptr_OperatorState == '\x01') {
    bVar1 = *(byte *)((long)&state_p[2]._vptr_OperatorState + 1);
  }
  else {
    *(undefined1 *)&state_p[2]._vptr_OperatorState = 1;
    if (this->caching_supported == true) {
      bVar1 = PhysicalOperator::OperatorCachingAllowed(context);
    }
    else {
      bVar1 = false;
    }
    *(byte *)((long)&state_p[2]._vptr_OperatorState + 1) = bVar1;
  }
  if (((bVar1 & 1) != 0) && (chunk->count < 0x40)) {
    this_00 = (__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
              (state_p + 1);
    if (state_p[1]._vptr_OperatorState == (_func_int **)0x0) {
      this_01 = (DataChunk *)operator_new(0x40);
      DataChunk::DataChunk(this_01);
      ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
                (this_00,this_01);
      pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)this_00);
      pAVar4 = Allocator::Get(context->client);
      DataChunk::GetTypes(&vStack_48,chunk);
      DataChunk::Initialize(pDVar3,pAVar4,&vStack_48,0x800);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&vStack_48);
    }
    pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)this_00);
    DataChunk::Append(pDVar3,chunk,false,(SelectionVector *)0x0,0);
    pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)this_00);
    if (((OperatorResultType)iVar2 == FINISHED) || (0x7bf < pDVar3->count)) {
      chunk_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)this_00);
      DataChunk::Move(chunk,chunk_00);
      pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)this_00);
      pAVar4 = Allocator::Get(context->client);
      DataChunk::GetTypes(&vStack_48,chunk);
      DataChunk::Initialize(pDVar3,pAVar4,&vStack_48,0x800);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&vStack_48);
    }
    else {
      DataChunk::Reset(chunk);
    }
  }
  return (OperatorResultType)iVar2;
}

Assistant:

OperatorResultType CachingPhysicalOperator::Execute(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                    GlobalOperatorState &gstate, OperatorState &state_p) const {
	auto &state = state_p.Cast<CachingOperatorState>();

	// Execute child operator
	auto child_result = ExecuteInternal(context, input, chunk, gstate, state);

#if STANDARD_VECTOR_SIZE >= 128
	if (!state.initialized) {
		state.initialized = true;
		state.can_cache_chunk = caching_supported && PhysicalOperator::OperatorCachingAllowed(context);
	}
	if (!state.can_cache_chunk) {
		return child_result;
	}
	// TODO chunk size of 0 should not result in a cache being created!
	if (chunk.size() < CACHE_THRESHOLD) {
		// we have filtered out a significant amount of tuples
		// add this chunk to the cache and continue

		if (!state.cached_chunk) {
			state.cached_chunk = make_uniq<DataChunk>();
			state.cached_chunk->Initialize(Allocator::Get(context.client), chunk.GetTypes());
		}

		state.cached_chunk->Append(chunk);

		if (state.cached_chunk->size() >= (STANDARD_VECTOR_SIZE - CACHE_THRESHOLD) ||
		    child_result == OperatorResultType::FINISHED) {
			// chunk cache full: return it
			chunk.Move(*state.cached_chunk);
			state.cached_chunk->Initialize(Allocator::Get(context.client), chunk.GetTypes());
			return child_result;
		} else {
			// chunk cache not full return empty result
			chunk.Reset();
		}
	}
#endif

	return child_result;
}